

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionally_enabled_mutex.hpp
# Opt level: O0

void __thiscall
asio::detail::conditionally_enabled_mutex::scoped_lock::scoped_lock
          (scoped_lock *this,conditionally_enabled_mutex *m)

{
  long in_RSI;
  noncopyable *in_RDI;
  
  noncopyable::noncopyable(in_RDI);
  *(long *)in_RDI = in_RSI;
  if ((*(byte *)(in_RSI + 0x30) & 1) == 0) {
    in_RDI[8] = (noncopyable)0x0;
  }
  else {
    posix_mutex::lock((posix_mutex *)0x3acbc3);
    in_RDI[8] = (noncopyable)0x1;
  }
  return;
}

Assistant:

explicit scoped_lock(conditionally_enabled_mutex& m)
      : mutex_(m)
    {
      if (m.enabled_)
      {
        mutex_.mutex_.lock();
        locked_ = true;
      }
      else
        locked_ = false;
    }